

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::removePage(QWizard *this,int id)

{
  long lVar1;
  PageMap *this_00;
  int *piVar2;
  QWizardPrivate *this_01;
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar3;
  size_t sVar4;
  _Rb_tree_node_base *p_Var5;
  QWizardPrivate *this_02;
  QWizardField *pQVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  QWidget *widget;
  _Rb_tree_color _Var10;
  long lVar11;
  QList<QWizardField> *this_03;
  ulong uVar12;
  long in_FS_OFFSET;
  int local_50;
  int local_4c;
  void *local_48;
  int *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  this_00 = &this_01->pageMap;
  pQVar3 = (this_01->pageMap).d.d.ptr;
  local_50 = id;
  if (((pQVar3 != (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                   *)0x0) &&
      (sVar4 = (pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count, 0 < (long)sVar4)) &&
     (this_01->start == id)) {
    p_Var5 = *(_Base_ptr *)((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    _Var10 = p_Var5[1]._M_color;
    if ((_Var10 == id) && (_Var10 = ~_S_red, sVar4 != 1)) {
      lVar9 = std::_Rb_tree_increment(p_Var5);
      _Var10 = *(_Rb_tree_color *)(lVar9 + 0x20);
    }
    this_01->start = _Var10;
    this_01->startSetByUser = false;
  }
  bVar7 = QMap<int,_QWizardPage_*>::contains(this_00,&local_50);
  if (bVar7) {
    local_40 = &local_4c;
    local_4c = local_50;
    local_48 = (void *)0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_48);
  }
  lVar9 = (this_01->history).d.size;
  if (lVar9 == 0) {
LAB_0050d87e:
    widget = &QMap<int,_QWizardPage_*>::take(this_00,&local_50)->super_QWidget;
  }
  else {
    lVar11 = 0;
    do {
      if (lVar9 * 4 - lVar11 == 0) goto LAB_0050d87e;
      lVar1 = lVar11 + 4;
      piVar2 = (int *)((long)(this_01->history).d.ptr + lVar11);
      lVar11 = lVar1;
    } while (*piVar2 != local_50);
    if (lVar1 == 0) goto LAB_0050d87e;
    if (local_50 != this_01->current) {
      widget = &QMap<int,_QWizardPage_*>::take(this_00,&local_50)->super_QWidget;
      QtPrivate::sequential_erase_one<QList<int>,int>(&this_01->history,&local_50);
      QWizardPrivate::_q_updateButtonStates(this_01);
      goto LAB_0050d896;
    }
    if (lVar9 != 1) {
      this_02 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
      uVar8 = (int)(this_02->history).d.size - 2;
      if (-1 < (int)uVar8) {
        QWizardPrivate::switchToPage(this_02,(this_02->history).d.ptr[uVar8],Backward);
      }
      goto LAB_0050d87e;
    }
    QWizardPrivate::reset(this_01);
    widget = &QMap<int,_QWizardPage_*>::take(this_00,&local_50)->super_QWidget;
    pQVar3 = (this_01->pageMap).d.d.ptr;
    if ((pQVar3 != (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                    *)0x0) && ((pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      restart(this);
      goto LAB_0050d896;
    }
  }
  QWizardPrivate::updateCurrentPage(this_01);
LAB_0050d896:
  if (widget != (QWidget *)0x0) {
    if (*(char *)(*(long *)&widget->field_0x8 + 0x30e) == '\x01') {
      (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1e0))(this,local_50);
      *(undefined1 *)(*(long *)&widget->field_0x8 + 0x30e) = 0;
    }
    QLayout::removeWidget((QLayout *)this_01->pageVBoxLayout,widget);
    uVar8 = (int)(this_01->fields).d.size - 1;
    if (-1 < (int)uVar8) {
      lVar9 = (ulong)uVar8 << 7;
      uVar12 = (ulong)uVar8;
      do {
        pQVar6 = (this_01->fields).d.ptr;
        if (*(QWidget **)((long)&pQVar6->page + lVar9) == widget) {
          this_03 = (QList<QWizardField> *)(*(long *)&widget->field_0x8 + 0x2f0);
          QtPrivate::QMovableArrayOps<QWizardField>::emplace<QWizardField_const&>
                    ((QMovableArrayOps<QWizardField> *)this_03,
                     *(qsizetype *)(*(long *)&widget->field_0x8 + 0x300),
                     (QWizardField *)((long)&pQVar6->page + lVar9));
          QList<QWizardField>::end(this_03);
          QWizardPrivate::removeFieldAt(this_01,(int)uVar12);
        }
        lVar9 = lVar9 + -0x80;
        bVar7 = 0 < (long)uVar12;
        uVar12 = uVar12 - 1;
      } while (bVar7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::removePage(int id)
{
    Q_D(QWizard);

    QWizardPage *removedPage = nullptr;

    // update startItem accordingly
    if (d->pageMap.size() > 0) { // only if we have any pages
        if (d->start == id) {
            const int firstId = d->pageMap.constBegin().key();
            if (firstId == id) {
                if (d->pageMap.size() > 1)
                    d->start = (++d->pageMap.constBegin()).key(); // secondId
                else
                    d->start = -1; // removing the last page
            } else { // startSetByUser has to be "true" here
                d->start = firstId;
            }
            d->startSetByUser = false;
        }
    }

    if (d->pageMap.contains(id))
        emit pageRemoved(id);

    if (!d->history.contains(id)) {
        // Case 1: removing a page not in the history
        removedPage = d->pageMap.take(id);
        d->updateCurrentPage();
    } else if (id != d->current) {
        // Case 2: removing a page in the history before the current page
        removedPage = d->pageMap.take(id);
        d->history.removeOne(id);
        d->_q_updateButtonStates();
    } else if (d->history.size() == 1) {
        // Case 3: removing the current page which is the first (and only) one in the history
        d->reset();
        removedPage = d->pageMap.take(id);
        if (d->pageMap.isEmpty())
            d->updateCurrentPage();
        else
            restart();
    } else {
        // Case 4: removing the current page which is not the first one in the history
        back();
        removedPage = d->pageMap.take(id);
        d->updateCurrentPage();
    }

    if (removedPage) {
        if (removedPage->d_func()->initialized) {
            cleanupPage(id);
            removedPage->d_func()->initialized = false;
        }

        d->pageVBoxLayout->removeWidget(removedPage);

        for (int i = d->fields.size() - 1; i >= 0; --i) {
            if (d->fields.at(i).page == removedPage) {
                removedPage->d_func()->pendingFields += d->fields.at(i);
                d->removeFieldAt(i);
            }
        }
    }
}